

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

int __thiscall
ON_SimpleArray<ON_SubDEdgeChain_*>::NewCapacity(ON_SimpleArray<ON_SubDEdgeChain_*> *this)

{
  int local_34;
  int local_24;
  int delta_count;
  size_t cap_size;
  ON_SimpleArray<ON_SubDEdgeChain_*> *this_local;
  
  if (((ulong)((long)this->m_count * 8) < 0x10000001) || (this->m_count < 8)) {
    if (this->m_count < 3) {
      local_34 = 4;
    }
    else {
      local_34 = this->m_count << 1;
    }
    this_local._4_4_ = local_34;
  }
  else {
    local_24 = 0x2000008;
    if (this->m_count < 0x2000008) {
      local_24 = this->m_count;
    }
    this_local._4_4_ = this->m_count + local_24;
  }
  return this_local._4_4_;
}

Assistant:

int ON_SimpleArray<T>::NewCapacity() const
{
  // Note: 
  //   This code appears in ON_SimpleArray<T>::NewCapacity()
  //   and ON_ClassArray<T>::NewCapacity().  Changes made to
  //   either function should be made to both functions.
  //   Because this code is template code that has to
  //   support dynamic linking and the code is defined
  //   in a header, I'm using copy-and-paste rather
  //   than a static.

  // This function returns 2*m_count unless that will
  // result in an additional allocation of more than
  // cap_size bytes.  The cap_size concept was added in
  // January 2010 because some calculations on enormous
  // models were slightly underestimating the initial
  // Reserve() size and then wasting gigabytes of memory.

  // cap_size = 128 MB on 32-bit os, 256 MB on 64 bit os
  const size_t cap_size = 32*sizeof(void*)*1024*1024;
  if (m_count*sizeof(T) <= cap_size || m_count < 8)
    return ((m_count <= 2) ? 4 : 2*m_count);

  // Growing the array will increase the memory
  // use by more than cap_size.
  int delta_count = 8 + cap_size/sizeof(T);
  if ( delta_count > m_count )
    delta_count = m_count;
  return (m_count + delta_count);
}